

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int nLearnedStart_00;
  int nConfLimit_00;
  int fVerbose_00;
  int fShowPattern_00;
  uint uVar1;
  int iVar2;
  FILE *__stream;
  int *piVar3;
  Abc_Cex_t *pAVar4;
  abctime aVar5;
  char *pcVar6;
  int local_cc;
  int *pSimInfo_1;
  int *pSimInfo;
  FILE *pFile;
  char *pFileName;
  int *pModel;
  abctime clk;
  uint local_68;
  int nInsLimit;
  int nLearnedPerce;
  int nLearnedDelta;
  int nLearnedStart;
  int nConfLimit;
  int fVerbose;
  int fShowPattern;
  int fSilent;
  int fNewSolver;
  int fAndOuts;
  int fAlignPol;
  int RetValue;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_20;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_20 = pAbc;
  _RetValue = Abc_FrameReadNtk(pAbc);
  fNewSolver = 0;
  fSilent = 0;
  fShowPattern = 0;
  fVerbose = 0;
  nConfLimit = 0;
  nLearnedStart = 0;
  nLearnedDelta = 0;
  clk._4_4_ = 0;
  nLearnedPerce = 0;
  nInsLimit = 0;
  local_68 = 0;
  Extra_UtilGetoptReset();
LAB_00290058:
  do {
    fAlignPol = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"CILDEpansvwh");
    if (fAlignPol == -1) {
      if (argv_local._4_4_ == globalUtilOptind + 1) {
        pFileName = (char *)0x0;
        pcVar6 = *(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18);
        __stream = fopen(pcVar6,"rb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",pcVar6);
          return 0;
        }
        fclose(__stream);
        fShowPattern_00 = nConfLimit;
        fVerbose_00 = nLearnedStart;
        nConfLimit_00 = nLearnedDelta;
        nLearnedStart_00 = nLearnedPerce;
        iVar2 = nInsLimit;
        uVar1 = local_68;
        if (_RetValue == (Abc_Ntk_t *)0x0) {
          local_cc = 0;
        }
        else {
          local_cc = Abc_NtkPiNum(_RetValue);
        }
        Cnf_DataSolveFromFile
                  (pcVar6,nConfLimit_00,nLearnedStart_00,iVar2,uVar1,fVerbose_00,fShowPattern_00,
                   (int **)&pFileName,local_cc);
        if ((pFileName != (char *)0x0) && (_RetValue != (Abc_Ntk_t *)0x0)) {
          piVar3 = Abc_NtkVerifySimulatePattern(_RetValue,(int *)pFileName);
          if (*piVar3 != 1) {
            Abc_Print(1,"ERROR in mapping PIs into SAT vars: Generated CEX is invalid.\n");
          }
          if (piVar3 != (int *)0x0) {
            free(piVar3);
          }
          iVar2 = Abc_NtkPiNum(_RetValue);
          pAVar4 = Abc_CexCreate(0,iVar2,(int *)pFileName,0,0,0);
          pAStack_20->pCex = pAVar4;
        }
        if (pFileName != (char *)0x0) {
          free(pFileName);
        }
        return 0;
      }
      if (_RetValue == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar2 = Abc_NtkLatchNum(_RetValue);
      if (0 < iVar2) {
        Abc_Print(-1,"Currently can only solve the miter for combinational circuits.\n");
        return 0;
      }
      iVar2 = Abc_NtkPoNum(_RetValue);
      if (iVar2 != 1) {
        Abc_Print(-1,"Currently expects a single-output miter.\n");
        return 0;
      }
      iVar2 = Abc_NtkIsStrash(_RetValue);
      if (iVar2 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      pModel = (int *)Abc_Clock();
      fAndOuts = Abc_NtkDSat(_RetValue,(long)nLearnedDelta,(long)(int)clk._4_4_,nLearnedPerce,
                             nInsLimit,local_68,fNewSolver,fSilent,fShowPattern,nLearnedStart);
      if ((fAndOuts == 0) && (iVar2 = Abc_NtkPoNum(_RetValue), iVar2 == 1)) {
        piVar3 = Abc_NtkVerifySimulatePattern(_RetValue,_RetValue->pModel);
        if (*piVar3 != 1) {
          Abc_Print(1,"ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n");
        }
        if (piVar3 != (int *)0x0) {
          free(piVar3);
        }
        iVar2 = Abc_NtkPiNum(_RetValue);
        pAVar4 = Abc_CexCreate(0,iVar2,_RetValue->pModel,0,0,0);
        pAStack_20->pCex = pAVar4;
      }
      pAStack_20->Status = fAndOuts;
      if (fVerbose == 0) {
        if (fAndOuts == -1) {
          Abc_Print(1,"UNDECIDED      ");
        }
        else if (fAndOuts == 0) {
          Abc_Print(1,"SATISFIABLE    ");
        }
        else {
          Abc_Print(1,"UNSATISFIABLE  ");
        }
        aVar5 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar5 - (long)pModel);
      }
      return 0;
    }
    switch(fAlignPol) {
    case 0x43:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00290709;
      }
      nLearnedDelta = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      uVar1 = nLearnedDelta;
      break;
    case 0x44:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_00290709;
      }
      nInsLimit = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      uVar1 = nInsLimit;
      break;
    case 0x45:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-E\" should be followed by an integer.\n");
        goto LAB_00290709;
      }
      local_68 = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      uVar1 = local_68;
      break;
    default:
      goto LAB_00290709;
    case 0x49:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_00290709;
      }
      clk._4_4_ = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      uVar1 = clk._4_4_;
      break;
    case 0x4c:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_00290709;
      }
      nLearnedPerce = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      uVar1 = nLearnedPerce;
      break;
    case 0x61:
      fSilent = fSilent ^ 1;
      goto LAB_00290058;
    case 0x68:
      goto LAB_00290709;
    case 0x6e:
      fShowPattern = fShowPattern ^ 1;
      goto LAB_00290058;
    case 0x70:
      fNewSolver = fNewSolver ^ 1;
      goto LAB_00290058;
    case 0x73:
      fVerbose = fVerbose ^ 1;
      goto LAB_00290058;
    case 0x76:
      nLearnedStart = nLearnedStart ^ 1;
      goto LAB_00290058;
    case 0x77:
      nConfLimit = nConfLimit ^ 1;
      goto LAB_00290058;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar1 < 0) {
LAB_00290709:
      Abc_Print(-2,"usage: dsat [-CILDE num] [-pansvh]\n");
      Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
      Abc_Print(-2,"\t         derives CNF from the current network and leaves it unchanged\n");
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                (ulong)(uint)nLearnedDelta);
      Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",(ulong)clk._4_4_
               );
      Abc_Print(-2,"\t-L num : starting value for learned clause removal [default = %d]\n",
                (ulong)(uint)nLearnedPerce);
      Abc_Print(-2,"\t-D num : delta value for learned clause removal [default = %d]\n",
                (ulong)(uint)nInsLimit);
      Abc_Print(-2,"\t-E num : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)local_68);
      pcVar6 = "no";
      if (fNewSolver != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-p     : align polarity of SAT variables [default = %s]\n",pcVar6);
      pcVar6 = "ORing";
      if (fSilent != 0) {
        pcVar6 = "ANDing";
      }
      Abc_Print(-2,"\t-a     : toggle ANDing/ORing of miter outputs [default = %s]\n",pcVar6);
      pcVar6 = "no";
      if (fShowPattern != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle using new solver [default = %s]\n",pcVar6);
      pcVar6 = "no";
      if (fVerbose != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-s     : enable silent computation (no reporting) [default = %s]\n",pcVar6);
      pcVar6 = "no";
      if (nLearnedStart != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int RetValue;
    int fAlignPol;
    int fAndOuts;
    int fNewSolver;
    int fSilent;
    int fShowPattern;
    int fVerbose;
    int nConfLimit;
    int nLearnedStart;
    int nLearnedDelta;
    int nLearnedPerce;
    int nInsLimit;
    abctime clk;

    extern int Abc_NtkDSat( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fAlignPol, int fAndOuts, int fNewSolver, int fVerbose );
    // set defaults
    fAlignPol  = 0;
    fAndOuts   = 0;
    fNewSolver = 0;
    fSilent    = 0;
    fShowPattern = 0;
    fVerbose   = 0;
    nConfLimit = 0;
    nInsLimit  = 0;
    nLearnedStart = 0;
    nLearnedDelta = 0;
    nLearnedPerce = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CILDEpansvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedPerce < 0 )
                goto usage;
            break;
        case 'p':
            fAlignPol ^= 1;
            break;
        case 'a':
            fAndOuts ^= 1;
            break;
        case 'n':
            fNewSolver ^= 1;
            break;
        case 's':
            fSilent ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fShowPattern ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 1 )
    {
        int * pModel = NULL;
        extern int Cnf_DataSolveFromFile( char * pFileName, int nConfLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fVerbose, int fShowPattern, int ** ppModel, int nPis );
        // get the input file name
        char * pFileName = argv[globalUtilOptind];
        FILE * pFile = fopen( pFileName, "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        Cnf_DataSolveFromFile( pFileName, nConfLimit, nLearnedStart, nLearnedDelta, nLearnedPerce, fVerbose, fShowPattern, &pModel, pNtk ? Abc_NtkPiNum(pNtk) : 0 );
        if ( pModel && pNtk )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pModel );
            if ( pSimInfo[0] != 1 )
                Abc_Print( 1, "ERROR in mapping PIs into SAT vars: Generated CEX is invalid.\n" );
            ABC_FREE( pSimInfo );
            pAbc->pCex = Abc_CexCreate( 0, Abc_NtkPiNum(pNtk), pModel, 0, 0, 0 );
        }
        ABC_FREE( pModel );
        return 0;
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }

    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently expects a single-output miter.\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    clk = Abc_Clock();
    RetValue = Abc_NtkDSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, nLearnedStart, nLearnedDelta, nLearnedPerce, fAlignPol, fAndOuts, fNewSolver, fVerbose );
    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        pAbc->pCex = Abc_CexCreate( 0, Abc_NtkPiNum(pNtk), pNtk->pModel, 0, 0, 0 );
    }
    pAbc->Status = RetValue;
    if ( !fSilent )
    {
        if ( RetValue == -1 )
            Abc_Print( 1, "UNDECIDED      " );
        else if ( RetValue == 0 )
            Abc_Print( 1, "SATISFIABLE    " );
        else
            Abc_Print( 1, "UNSATISFIABLE  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsat [-CILDE num] [-pansvh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leaves it unchanged\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-L num : starting value for learned clause removal [default = %d]\n", nLearnedStart );
    Abc_Print( -2, "\t-D num : delta value for learned clause removal [default = %d]\n", nLearnedDelta );
    Abc_Print( -2, "\t-E num : ratio percentage for learned clause removal [default = %d]\n", nLearnedPerce );
    Abc_Print( -2, "\t-p     : align polarity of SAT variables [default = %s]\n", fAlignPol? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle ANDing/ORing of miter outputs [default = %s]\n", fAndOuts? "ANDing": "ORing" );
    Abc_Print( -2, "\t-n     : toggle using new solver [default = %s]\n", fNewSolver? "yes": "no" );
    Abc_Print( -2, "\t-s     : enable silent computation (no reporting) [default = %s]\n", fSilent? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}